

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_tec_fill(REF_CELL ref_cell,char *filename)

{
  REF_STATUS RVar1;
  FILE *__stream;
  FILE *file;
  REF_INT nodes [27];
  uint local_24;
  REF_INT cell_node;
  REF_INT cell;
  char *filename_local;
  REF_CELL ref_cell_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x5eb,
           "ref_cell_tec_fill","unable to open file");
    ref_cell_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine cell fill\"\n");
    fprintf(__stream,"variables = \"node\" \"cell\"\n");
    fprintf(__stream,"zone t=\"fill\", i=%d, datapacking=%s\n",
            (ulong)(uint)(ref_cell->node_per * ref_cell->n),"point");
    for (local_24 = 0; (int)local_24 < ref_cell->max; local_24 = local_24 + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_24,(REF_INT *)&file);
      if (RVar1 == 0) {
        for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell->node_per; nodes[0x1a] = nodes[0x1a] + 1) {
          fprintf(__stream," %d %d\n",
                  (ulong)(uint)ref_cell->c2n[(int)(nodes[0x1a] + ref_cell->size_per * local_24)],
                  (ulong)local_24);
        }
      }
    }
    fclose(__stream);
    ref_cell_local._4_4_ = 0;
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_tec_fill(REF_CELL ref_cell, const char *filename) {
  REF_INT cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine cell fill\"\n");
  fprintf(file, "variables = \"node\" \"cell\"\n");

  fprintf(file, "zone t=\"fill\", i=%d, datapacking=%s\n",
          ref_cell_node_per(ref_cell) * ref_cell_n(ref_cell), "point");

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_node(ref_cell, cell_node) {
      fprintf(file, " %d %d\n", ref_cell_c2n(ref_cell, cell_node, cell), cell);
    }
  }

  fclose(file);

  return REF_SUCCESS;
}